

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_16x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  ushort uVar7;
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  undefined1 auVar20 [16];
  short sVar35;
  short sVar37;
  undefined1 auVar36 [16];
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar42;
  ushort uVar43;
  ushort uVar44;
  short sVar45;
  ushort uVar46;
  ushort uVar47;
  short sVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  ushort uVar52;
  ushort uVar53;
  short sVar54;
  ushort uVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  ushort uVar59;
  undefined1 auVar41 [16];
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  
  auVar16 = _DAT_0051d5f0;
  auVar15 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  sVar35 = auVar15._0_2_;
  sVar37 = auVar15._2_2_;
  auVar20._2_2_ = sVar37 * 0x1f;
  auVar20._0_2_ = sVar35;
  auVar20._4_2_ = sVar35 * 0x3c;
  auVar20._6_2_ = sVar37 * 0x56;
  auVar20._8_2_ = sVar35 * 0x6f;
  auVar20._10_2_ = sVar37 * 0x85;
  auVar20._12_2_ = sVar35 * 0x9a;
  auVar20._14_2_ = sVar37 * 0xac;
  auVar15 = *(undefined1 (*) [16])top_row;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar15._0_13_;
  auVar1[0xe] = auVar15[7];
  auVar2[0xc] = auVar15[6];
  auVar2._0_12_ = auVar15._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar15._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar15[5];
  auVar4._0_10_ = auVar15._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar15._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar15[4];
  auVar6._0_8_ = auVar15._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar6._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),auVar15[3]);
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = auVar15[2];
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = auVar15[1];
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar41._4_4_ = uVar14;
    auVar41._0_4_ = uVar14;
    auVar41._8_4_ = uVar14;
    auVar41._12_4_ = uVar14;
    auVar36 = pshufb(auVar16,auVar41);
    auVar41 = pshufb(auVar20,auVar41);
    sVar17 = (short)Var9;
    uVar7 = auVar1._13_2_ >> 8;
    sVar38 = auVar41._0_2_ + 0x80;
    sVar42 = auVar41._2_2_ + 0x80;
    sVar45 = auVar41._4_2_ + 0x80;
    sVar48 = auVar41._6_2_ + 0x80;
    sVar51 = auVar41._8_2_ + 0x80;
    sVar54 = auVar41._10_2_ + 0x80;
    sVar57 = auVar41._12_2_ + 0x80;
    sVar60 = auVar41._14_2_ + 0x80;
    uVar18 = auVar36._0_2_ * (ushort)auVar15[0] + sVar38;
    uVar21 = auVar36._2_2_ * auVar11._0_2_ + sVar42;
    uVar23 = auVar36._4_2_ * auVar10._0_2_ + sVar45;
    uVar25 = auVar36._6_2_ * sVar17 + sVar48;
    uVar27 = auVar36._8_2_ * auVar6._8_2_ + sVar51;
    uVar29 = auVar36._10_2_ * auVar4._10_2_ + sVar54;
    uVar31 = auVar36._12_2_ * auVar2._12_2_ + sVar57;
    uVar33 = auVar36._14_2_ * uVar7 + sVar60;
    uVar19 = uVar18 >> 8;
    uVar22 = uVar21 >> 8;
    uVar24 = uVar23 >> 8;
    uVar26 = uVar25 >> 8;
    uVar28 = uVar27 >> 8;
    uVar30 = uVar29 >> 8;
    uVar32 = uVar31 >> 8;
    uVar34 = uVar33 >> 8;
    uVar39 = sVar38 + auVar36._0_2_ * (ushort)auVar15[8];
    uVar43 = sVar42 + auVar36._2_2_ * (ushort)auVar15[9];
    uVar46 = sVar45 + auVar36._4_2_ * (ushort)auVar15[10];
    uVar49 = sVar48 + auVar36._6_2_ * (ushort)auVar15[0xb];
    uVar52 = sVar51 + auVar36._8_2_ * (ushort)auVar15[0xc];
    uVar55 = sVar54 + auVar36._10_2_ * (ushort)auVar15[0xd];
    uVar58 = sVar57 + auVar36._12_2_ * (ushort)auVar15[0xe];
    uVar61 = sVar60 + auVar36._14_2_ * (ushort)auVar15[0xf];
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar47 = uVar46 >> 8;
    uVar50 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar62 = uVar61 >> 8;
    *dst = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
    dst[1] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
    dst[2] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    dst[3] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
    dst[4] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
    dst[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst[6] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
    dst[7] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[9] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    dst[10] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    dst[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    dst[0xd] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    dst[0xf] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    auVar41 = _DAT_0051d620;
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  auVar16._0_2_ = sVar35 * 0xbc;
  auVar16._2_2_ = sVar37 * 0xca;
  auVar16._4_2_ = sVar35 * 0xd5;
  auVar16._6_2_ = sVar37 * 0xdf;
  auVar16._8_2_ = sVar35 * 0xe6;
  auVar16._10_2_ = sVar37 * 0xec;
  auVar16._12_2_ = sVar35 * 0xef;
  auVar16._14_2_ = sVar37 * 0xf0;
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar36._4_4_ = uVar14;
    auVar36._0_4_ = uVar14;
    auVar36._8_4_ = uVar14;
    auVar36._12_4_ = uVar14;
    auVar20 = pshufb(auVar41,auVar36);
    auVar36 = pshufb(auVar16,auVar36);
    sVar35 = auVar36._0_2_ + 0x80;
    sVar37 = auVar36._2_2_ + 0x80;
    sVar38 = auVar36._4_2_ + 0x80;
    sVar42 = auVar36._6_2_ + 0x80;
    sVar45 = auVar36._8_2_ + 0x80;
    sVar48 = auVar36._10_2_ + 0x80;
    sVar51 = auVar36._12_2_ + 0x80;
    sVar54 = auVar36._14_2_ + 0x80;
    uVar18 = auVar20._0_2_ * (ushort)auVar15[0] + sVar35;
    uVar21 = auVar20._2_2_ * auVar11._0_2_ + sVar37;
    uVar23 = auVar20._4_2_ * auVar10._0_2_ + sVar38;
    uVar25 = auVar20._6_2_ * sVar17 + sVar42;
    uVar27 = auVar20._8_2_ * auVar6._8_2_ + sVar45;
    uVar29 = auVar20._10_2_ * auVar4._10_2_ + sVar48;
    uVar31 = auVar20._12_2_ * auVar2._12_2_ + sVar51;
    uVar33 = auVar20._14_2_ * uVar7 + sVar54;
    uVar19 = uVar18 >> 8;
    uVar22 = uVar21 >> 8;
    uVar24 = uVar23 >> 8;
    uVar26 = uVar25 >> 8;
    uVar28 = uVar27 >> 8;
    uVar30 = uVar29 >> 8;
    uVar32 = uVar31 >> 8;
    uVar34 = uVar33 >> 8;
    uVar39 = sVar35 + auVar20._0_2_ * (ushort)auVar15[8];
    uVar43 = sVar37 + auVar20._2_2_ * (ushort)auVar15[9];
    uVar46 = sVar38 + auVar20._4_2_ * (ushort)auVar15[10];
    uVar49 = sVar42 + auVar20._6_2_ * (ushort)auVar15[0xb];
    uVar52 = sVar45 + auVar20._8_2_ * (ushort)auVar15[0xc];
    uVar55 = sVar48 + auVar20._10_2_ * (ushort)auVar15[0xd];
    uVar58 = sVar51 + auVar20._12_2_ * (ushort)auVar15[0xe];
    uVar61 = sVar54 + auVar20._14_2_ * (ushort)auVar15[0xf];
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar47 = uVar46 >> 8;
    uVar50 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar62 = uVar61 >> 8;
    *dst = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
    dst[1] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
    dst[2] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    dst[3] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
    dst[4] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
    dst[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst[6] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
    dst[7] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[9] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    dst[10] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    dst[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    dst[0xd] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    dst[0xf] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights_lo = cvtepu8_epi16(weights);
  const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
  const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
  const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
  const __m128i scaled_bottom_left_lo =
      _mm_mullo_epi16(inverted_weights_lo, bottom_left);
  const __m128i scaled_bottom_left_hi =
      _mm_mullo_epi16(inverted_weights_hi, bottom_left);
  const __m128i round = _mm_set1_epi16(128);

  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}